

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sound.cpp
# Opt level: O2

void SdlCallback(void *pUnused,Uint8 *pStream,int Len)

{
  int *piVar1;
  int iVar2;
  CSample *pCVar3;
  ulong uVar4;
  int iVar5;
  int *piVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  short *psVar18;
  CVoice *v;
  ulong uVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  
  uVar4 = (long)Len / 4;
  mem_zero(m_pMixBuffer,m_MaxFrames << 3);
  uVar19 = (ulong)m_MaxFrames;
  uVar13 = (ulong)m_MaxFrames;
  if ((uint)uVar4 < m_MaxFrames) {
    uVar13 = uVar4 & 0xffffffff;
  }
  lock_wait(m_SoundLock);
  iVar5 = m_SoundVolume;
  for (lVar17 = 0; piVar6 = m_pMixBuffer, fVar22 = m_MaxDistance, lVar17 != 0x40;
      lVar17 = lVar17 + 1) {
    pCVar3 = m_aVoices[lVar17].m_pSample;
    if (pCVar3 != (CSample *)0x0) {
      iVar15 = pCVar3->m_Channels;
      iVar10 = m_aVoices[lVar17].m_Tick;
      iVar8 = pCVar3->m_NumFrames;
      iVar2 = (m_aVoices[lVar17].m_pChannel)->m_Vol;
      psVar18 = pCVar3->m_pData + iVar10 * iVar15;
      iVar9 = iVar2;
      iVar7 = iVar2;
      if ((m_aVoices[lVar17].m_Flags & 2) != 0) {
        iVar9 = m_aVoices[lVar17].m_Y - m_CenterY;
        fVar20 = (float)(m_aVoices[lVar17].m_X - m_CenterX);
        fVar21 = SQRT(fVar20 * fVar20 + (float)(iVar9 * iVar9));
        iVar7 = 0;
        if (0.0 <= fVar21) {
          iVar9 = 0;
          if (fVar21 < m_MaxDistance) {
            fVar20 = 0.5 - (fVar20 / m_MaxDistance) * 0.5;
            if (fVar20 < 0.0) {
              fVar23 = sqrtf(fVar20);
            }
            else {
              fVar23 = SQRT(fVar20);
            }
            fVar20 = 1.0 - fVar20;
            if (fVar20 < 0.0) {
              fVar20 = sqrtf(fVar20);
            }
            else {
              fVar20 = SQRT(fVar20);
            }
            fVar22 = (float)iVar2 * (1.0 - fVar21 / fVar22);
            iVar9 = (int)(fVar22 * fVar20);
            iVar7 = (int)(fVar23 * fVar22);
          }
        }
        else {
          iVar9 = 0;
        }
      }
      uVar14 = iVar8 - iVar10;
      uVar12 = uVar4 & 0xffffffff;
      if (uVar19 < (uVar4 & 0xffffffff)) {
        uVar12 = uVar19;
      }
      uVar11 = (uint)uVar12;
      if (uVar14 <= uVar12) {
        uVar11 = uVar14;
      }
      for (lVar16 = 0; uVar11 != (uint)lVar16; lVar16 = lVar16 + 1) {
        piVar1 = piVar6 + lVar16 * 2;
        *piVar1 = *piVar1 + *psVar18 * iVar7;
        piVar1 = piVar6 + lVar16 * 2 + 1;
        *piVar1 = *piVar1 + *(short *)((long)psVar18 + (ulong)((uint)((long)iVar15 != 1) * 2)) *
                            iVar9;
        m_aVoices[lVar17].m_Tick = m_aVoices[lVar17].m_Tick + 1;
        psVar18 = psVar18 + iVar15;
      }
      if (m_aVoices[lVar17].m_Tick == (m_aVoices[lVar17].m_pSample)->m_NumFrames) {
        if ((m_aVoices[lVar17].m_Flags & 1) == 0) {
          m_aVoices[lVar17].m_pSample = (CSample *)0x0;
        }
        else {
          m_aVoices[lVar17].m_Tick = 0;
        }
      }
    }
  }
  lock_unlock(m_SoundLock);
  piVar6 = m_pMixBuffer;
  iVar15 = 1;
  while (iVar10 = (int)uVar13, uVar13 = (ulong)(iVar10 - 1), iVar10 != 0) {
    iVar10 = (piVar6[iVar15 + -1] * iVar5) / 0x65 >> 8;
    if (0x7ffe < iVar10) {
      iVar10 = 0x7fff;
    }
    if (iVar10 < -0x7fff) {
      iVar10 = -0x8000;
    }
    iVar8 = (piVar6[iVar15] * iVar5) / 0x65 >> 8;
    *(short *)(pStream + (long)(iVar15 + -1) * 2) = (short)iVar10;
    if (0x7ffe < iVar8) {
      iVar8 = 0x7fff;
    }
    if (iVar8 < -0x7fff) {
      iVar8 = -0x8000;
    }
    *(short *)(pStream + (long)iVar15 * 2) = (short)iVar8;
    iVar15 = iVar15 + 2;
  }
  return;
}

Assistant:

static void SdlCallback(void *pUnused, Uint8 *pStream, int Len)
{
	(void)pUnused;
	Mix((short *)pStream, Len/2/2);
}